

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O2

void RecyclerTestObject::EndWalk(void)

{
  DoVerify(currentWalkDepth == 0,"currentWalkDepth == 0",
           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/RecyclerTestObject.h"
           ,0x4c);
  PAL_wprintf(L"Full heap walk finished\n");
  PAL_wprintf(L"Object Count:           %12llu\n",walkObjectCount);
  PAL_wprintf(L"Scanned Bytes:          %12llu\n",walkScannedByteCount);
  PAL_wprintf(L"Barrier Bytes:          %12llu\n",walkBarrierByteCount);
  PAL_wprintf(L"Tracked Bytes:          %12llu\n",walkTrackedByteCount);
  PAL_wprintf(L"Finalized Bytes:        %12llu\n",walkFinalizedByteCount);
  PAL_wprintf(L"RecyclerVisited Bytes:  %12llu\n",walkRecyclerVisitedByteCount);
  PAL_wprintf(L"Leaf Bytes:             %12llu\n",walkLeafByteCount);
  PAL_wprintf(L"Total Bytes:            %12llu\n",
              walkBarrierByteCount + walkScannedByteCount + walkTrackedByteCount +
              walkFinalizedByteCount + walkLeafByteCount + walkRecyclerVisitedByteCount);
  PAL_wprintf(L"Max Depth:              %12llu\n",maxWalkDepth);
  return;
}

Assistant:

static void EndWalk()
    {
        VerifyCondition(currentWalkDepth == 0);

        wprintf(_u("Full heap walk finished\n"));
        wprintf(_u("Object Count:           %12llu\n"), (unsigned long long) walkObjectCount);
        wprintf(_u("Scanned Bytes:          %12llu\n"), (unsigned long long) walkScannedByteCount);
        wprintf(_u("Barrier Bytes:          %12llu\n"), (unsigned long long) walkBarrierByteCount);
        wprintf(_u("Tracked Bytes:          %12llu\n"), (unsigned long long) walkTrackedByteCount);
        wprintf(_u("Finalized Bytes:        %12llu\n"), (unsigned long long) walkFinalizedByteCount);
        wprintf(_u("RecyclerVisited Bytes:  %12llu\n"), (unsigned long long) walkRecyclerVisitedByteCount);
        wprintf(_u("Leaf Bytes:             %12llu\n"), (unsigned long long) walkLeafByteCount);
        wprintf(_u("Total Bytes:            %12llu\n"), (unsigned long long) (walkScannedByteCount + walkBarrierByteCount + walkTrackedByteCount + walkFinalizedByteCount + walkLeafByteCount + walkRecyclerVisitedByteCount));
        wprintf(_u("Max Depth:              %12llu\n"), (unsigned long long) maxWalkDepth);
    }